

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.cc
# Opt level: O0

char * OpenMesh::IO::OMFormat::as_string(Entity e)

{
  char *pcStack_10;
  Entity e_local;
  
  switch(e) {
  case Entity_Vertex:
    pcStack_10 = "Vertex";
    break;
  case Entity_Mesh:
    pcStack_10 = "Mesh";
    break;
  case Entity_Face:
    pcStack_10 = "Face";
    break;
  default:
    std::operator<<((ostream *)&std::clog,"as_string(Chunk::Entity): Invalid value!");
    pcStack_10 = (char *)0x0;
    break;
  case Entity_Edge:
    pcStack_10 = "Edge";
    break;
  case Entity_Halfedge:
    pcStack_10 = "Halfedge";
  }
  return pcStack_10;
}

Assistant:

const char *as_string(Chunk::Entity e)
  {
    switch(e)
    {    
      case Chunk::Entity_Vertex:   return "Vertex";
      case Chunk::Entity_Mesh:     return "Mesh";
      case Chunk::Entity_Edge:     return "Edge";
      case Chunk::Entity_Halfedge: return "Halfedge";
      case Chunk::Entity_Face:     return "Face";
      default:
	std::clog << "as_string(Chunk::Entity): Invalid value!";
    }
    return NULL;
  }